

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O3

bool __thiscall
Js::AsmJsModuleCompiler::SetupFunctionArguments
          (AsmJsModuleCompiler *this,AsmJsFunc *func,ParseNodePtr pnode)

{
  TypedRegisterAllocator *this_00;
  OpCode OVar1;
  ParseNode *pPVar2;
  ParseNode *pPVar3;
  int iVar4;
  bool bVar5;
  Types TVar6;
  RegSlot RVar7;
  RegSlot RVar8;
  ParseNode *arg;
  IdentPtr name;
  AsmJsVarBase *arg_00;
  ParseNodeBin *pPVar9;
  PropertyName pIVar10;
  RegisterSpace *pRVar11;
  ParseNodeUni *pPVar12;
  ParseNodeInt *pPVar13;
  ParseNodeCall *pPVar14;
  IdentPtr name_00;
  AsmJsFunctionDeclaration *sym;
  ExclusiveContext *pEVar15;
  char16_t *message;
  ScriptContext *scriptContext;
  ArgSlot local_42;
  AsmJsFunc *pAStack_40;
  ArgSlot numArguments;
  int local_38;
  AsmJsVarType local_33;
  AsmJsVarType local_32;
  AsmJsVarType local_31;
  
  local_42 = 0;
  arg = ParserWrapper::FunctionArgsList(&func->mFncNode->super_ParseNode,&local_42);
  bVar5 = AsmJsFunctionDeclaration::EnsureArgCount(&func->super_AsmJsFunctionDeclaration,local_42);
  if (bVar5) {
    if (arg != (ParseNode *)0x0) {
      this_00 = &func->mTypedRegisterAllocator;
      local_38 = 0;
      pAStack_40 = func;
LAB_0094820d:
      if (pnode->nop != knopList) {
        scriptContext = this->mCx->scriptContext;
        message = L"Missing assignment statement for argument";
        goto LAB_009484e4;
      }
      bVar5 = ParserWrapper::IsDefinition(arg);
      if (!bVar5) {
        scriptContext = this->mCx->scriptContext;
        message = L"duplicate argument name not allowed";
        goto LAB_009484e4;
      }
      name = ParseNode::name(arg);
      bVar5 = AsmJSCompiler::CheckIdentifier(this,arg,name);
      if (!bVar5) {
        return false;
      }
      arg_00 = AsmJsFunc::DefineVar(func,name,true,true);
      if (arg_00 == (AsmJsVarBase *)0x0) {
        scriptContext = this->mCx->scriptContext;
        message = L"Failed to define var";
        goto LAB_009484e4;
      }
      pPVar9 = ParseNode::AsParseNodeBin(pnode);
      pPVar2 = pPVar9->pnode1;
      if (pPVar2->nop != knopAsg) {
        scriptContext = this->mCx->scriptContext;
        message = L"Expecting an assignment";
        goto LAB_009484e4;
      }
      pPVar9 = ParseNode::AsParseNodeBin(pPVar2);
      pPVar3 = pPVar9->pnode1;
      pPVar9 = ParseNode::AsParseNodeBin(pPVar2);
      if (pPVar3->nop == knopName) {
        pPVar2 = pPVar9->pnode2;
        pIVar10 = ParserWrapper::VariableName(pPVar3);
        if (pIVar10->m_propertyId != ((arg_00->super_AsmJsSymbol).mName)->m_propertyId)
        goto LAB_009484fe;
        OVar1 = pPVar2->nop;
        if (OVar1 == knopCall) {
          pPVar14 = ParseNode::AsParseNodeCall(pPVar2);
          if (pPVar14->pnodeTarget->nop == knopName) {
            name_00 = ParseNode::name(pPVar14->pnodeTarget);
            sym = LookupIdentifier<Js::AsmJsFunctionDeclaration>(this,name_00);
            if (sym == (AsmJsFunctionDeclaration *)0x0) {
              scriptContext = this->mCx->scriptContext;
              message = L"Cannot resolve function for argument definition, or wrong function";
              goto LAB_009484e4;
            }
            if ((sym->super_AsmJsSymbol).mType != MathBuiltinFunction) {
              scriptContext = this->mCx->scriptContext;
              message = L"Wrong function used for argument definition";
              goto LAB_009484e4;
            }
            bVar5 = AsmJsMathFunction::IsFround(sym);
            if (bVar5) {
              AsmJsVarType::AsmJsVarType(&local_31,Float);
              func = pAStack_40;
              (arg_00->super_AsmJsSymbol).field_0x14 = local_31.which_;
              RVar8 = AsmJsFunc::AcquireRegister<float>(pAStack_40);
              arg_00->mLocation = RVar8;
              if (pPVar14->argCount != 0) {
                pPVar2 = pPVar14->pnodeArgs;
                OVar1 = pPVar2->nop;
                goto joined_r0x00948441;
              }
              goto LAB_00948507;
            }
            pEVar15 = this->mCx;
          }
          else {
            pEVar15 = this->mCx;
          }
          scriptContext = pEVar15->scriptContext;
          message = L"call should be for fround";
          goto LAB_009484e4;
        }
        if (OVar1 != knopOr) {
          if (OVar1 != knopPos) {
            scriptContext = this->mCx->scriptContext;
            message = L"arguments are not casted as valid Asm.js type";
            goto LAB_009484e4;
          }
          AsmJsVarType::AsmJsVarType(&local_33,Double);
          (arg_00->super_AsmJsSymbol).field_0x14 = local_33.which_;
          TVar6 = WAsmJs::FromPrimitiveType<double>();
          pRVar11 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar6);
          RVar7 = WAsmJs::RegisterSpace::AcquireRegister(pRVar11);
          arg_00->mLocation = RVar7;
          pPVar12 = ParseNode::AsParseNodeUni(pPVar2);
          pPVar2 = pPVar12->pnode1;
          OVar1 = pPVar2->nop;
          func = pAStack_40;
joined_r0x00948441:
          if ((OVar1 != knopName) ||
             (pIVar10 = ParserWrapper::VariableName(pPVar2),
             pIVar10->m_propertyId != ((arg_00->super_AsmJsSymbol).mName)->m_propertyId)) {
LAB_00948507:
            pEVar15 = this->mCx;
            goto LAB_0094850e;
          }
LAB_0094845c:
          bVar5 = Phases::IsEnabled((Phases *)&DAT_015b6718,ByteCodePhase);
          if (bVar5) {
            Output::Print(L"    Argument [%s] Valid",&name->field_0x22);
          }
          iVar4 = local_38;
          bVar5 = AsmJsFunctionDeclaration::EnsureArgType
                            (&func->super_AsmJsFunctionDeclaration,arg_00,(ArgSlot)local_38);
          if (!bVar5) {
            scriptContext = this->mCx->scriptContext;
            message = L"Unexpected argument type";
            goto LAB_009484e4;
          }
          local_38 = iVar4 + 1;
          arg = ParserWrapper::NextVar(arg);
          pPVar9 = ParseNode::AsParseNodeBin(pnode);
          pnode = pPVar9->pnode2;
          if (arg == (ParseNode *)0x0) goto LAB_009484ca;
          goto LAB_0094820d;
        }
        AsmJsVarType::AsmJsVarType(&local_32,Int);
        (arg_00->super_AsmJsSymbol).field_0x14 = local_32.which_;
        TVar6 = WAsmJs::FromPrimitiveType<int>();
        pRVar11 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar6);
        RVar7 = WAsmJs::RegisterSpace::AcquireRegister(pRVar11);
        arg_00->mLocation = RVar7;
        pPVar9 = ParseNode::AsParseNodeBin(pPVar2);
        pPVar3 = pPVar9->pnode1;
        pPVar9 = ParseNode::AsParseNodeBin(pPVar2);
        if (pPVar3->nop != knopName) goto LAB_009484fe;
        pPVar2 = pPVar9->pnode2;
        pIVar10 = ParserWrapper::VariableName(pPVar3);
        func = pAStack_40;
        if (pIVar10->m_propertyId == ((arg_00->super_AsmJsSymbol).mName)->m_propertyId) {
          if ((pPVar2->nop == knopInt) &&
             (pPVar13 = ParseNode::AsParseNodeInt(pPVar2), pPVar13->lw == 0)) goto LAB_0094845c;
          scriptContext = this->mCx->scriptContext;
          message = L"Or value must be 0 when defining arguments";
          goto LAB_009484e4;
        }
      }
LAB_009484fe:
      pEVar15 = this->mCx;
LAB_0094850e:
      scriptContext = pEVar15->scriptContext;
      message = L"Defining wrong argument";
      goto LAB_009484e4;
    }
LAB_009484ca:
    func->mBodyNode = pnode;
    bVar5 = true;
  }
  else {
    scriptContext = this->mCx->scriptContext;
    message = L"Cannot have variable number of arguments";
LAB_009484e4:
    bVar5 = false;
    AsmJSCompiler::OutputError(scriptContext,message);
  }
  return bVar5;
}

Assistant:

bool AsmJsModuleCompiler::SetupFunctionArguments(AsmJsFunc * func, ParseNodePtr pnode)
    {
        // Check arguments
        ArgSlot numArguments = 0;
        ParseNode * fncNode = func->GetFncNode();
        ParseNode* argNode = ParserWrapper::FunctionArgsList(fncNode, numArguments);

        if (!func->EnsureArgCount(numArguments))
        {
            return Fail(argNode, _u("Cannot have variable number of arguments"));
        }

        ArgSlot index = 0;
        while (argNode)
        {
            if (pnode->nop != knopList)
            {
                return Fail(pnode, _u("Missing assignment statement for argument"));
            }


            if (!ParserWrapper::IsDefinition(argNode))
            {
                return Fail(argNode, _u("duplicate argument name not allowed"));
            }

            PropertyName argName = argNode->name();
            if (!AsmJSCompiler::CheckIdentifier(*this, argNode, argName))
            {
                return false;
            }

            // creates the variable
            AsmJsVarBase* var = func->DefineVar(argName, true);
            if (!var)
            {
                return Fail(argNode, _u("Failed to define var"));
            }

            ParseNode* argDefinition = ParserWrapper::GetBinaryLeft(pnode);
            if (argDefinition->nop != knopAsg)
            {
                return Fail(argDefinition, _u("Expecting an assignment"));
            }

            ParseNode* lhs = ParserWrapper::GetBinaryLeft(argDefinition);
            ParseNode* rhs = ParserWrapper::GetBinaryRight(argDefinition);

#define NodeDefineThisArgument(n,var) (n->nop == knopName && ParserWrapper::VariableName(n)->GetPropertyId() == var->GetName()->GetPropertyId())

            if (!NodeDefineThisArgument(lhs, var))
            {
                return Fail(lhs, _u("Defining wrong argument"));
            }

            if (rhs->nop == knopPos)
            {
                // unary + => double
                var->SetVarType(AsmJsVarType::Double);
                var->SetLocation(func->AcquireRegister<double>());
                // validate stmt
                ParseNode* argSym = ParserWrapper::GetUnaryNode(rhs);

                if (!NodeDefineThisArgument(argSym, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
            }
            else if (rhs->nop == knopOr)
            {
                var->SetVarType(AsmJsVarType::Int);
                var->SetLocation(func->AcquireRegister<int>());

                ParseNode* argSym = ParserWrapper::GetBinaryLeft(rhs);
                ParseNode* intSym = ParserWrapper::GetBinaryRight(rhs);
                // validate stmt
                if (!NodeDefineThisArgument(argSym, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
                if (intSym->nop != knopInt || intSym->AsParseNodeInt()->lw != 0)
                {
                    return Fail(lhs, _u("Or value must be 0 when defining arguments"));
                }
            }
            else if (rhs->nop == knopCall)
            {
                ParseNodeCall* callNode = rhs->AsParseNodeCall();
                if (callNode->pnodeTarget->nop != knopName)
                {
                    return Fail(rhs, _u("call should be for fround"));
                }
                AsmJsFunctionDeclaration* funcDecl = this->LookupFunction(callNode->pnodeTarget->name());

                if (!funcDecl)
                    return Fail(rhs, _u("Cannot resolve function for argument definition, or wrong function"));

                if (AsmJsMathFunction::Is(funcDecl))
                {
                    if (!AsmJsMathFunction::IsFround(funcDecl))
                    {
                        return Fail(rhs, _u("call should be for fround"));
                    }
                    var->SetVarType(AsmJsVarType::Float);
                    var->SetLocation(func->AcquireRegister<float>());
                }
                else
                {
                    return Fail(rhs, _u("Wrong function used for argument definition"));
                }

                if (callNode->argCount == 0 || !NodeDefineThisArgument(callNode->pnodeArgs, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
            }
            else
            {
                return Fail(rhs, _u("arguments are not casted as valid Asm.js type"));
            }

            if (PHASE_TRACE1(ByteCodePhase))
            {
                Output::Print(_u("    Argument [%s] Valid"), argName->Psz());
            }

            if (!func->EnsureArgType(var, index++))
            {
                return Fail(rhs, _u("Unexpected argument type"));
            }

            argNode = ParserWrapper::NextVar(argNode);
            pnode = ParserWrapper::GetBinaryRight(pnode);
        }

        func->SetBodyNode(pnode);
        return true;
    }